

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

void bitset_expand(BitSet *bm,size_t nb)

{
  bitset_el_t *pbVar1;
  ulong new_n;
  
  new_n = nb + 0x3f >> 6;
  if (bm->els_num < new_n) {
    if (bm->size < new_n) {
      pbVar1 = (bitset_el_t *)raviX_realloc_array(bm->varr,8,bm->size,new_n);
      bm->varr = pbVar1;
      bm->size = new_n;
    }
    bm->els_num = new_n;
  }
  return;
}

Assistant:

static void bitset_expand (BitSet * bm, size_t nb) {
	size_t new_len = (nb + BITMAP_WORD_BITS - 1) / BITMAP_WORD_BITS;
	if (new_len > bm->els_num) {
		if (new_len > bm->size) {
			bm->varr = (bitset_el_t *) raviX_realloc_array(bm->varr, sizeof(bitset_el_t), bm->size, new_len);
			bm->size = new_len;
		}
		bm->els_num = new_len;
	}
}